

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

int uv_mutex_trylock(uv_mutex_t *mutex)

{
  int iVar1;
  int err;
  uv_mutex_t *mutex_local;
  
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)mutex);
  if (iVar1 == 0) {
    mutex_local._4_4_ = 0;
  }
  else {
    if ((iVar1 != 0x10) && (iVar1 != 0xb)) {
      abort();
    }
    mutex_local._4_4_ = -0x10;
  }
  return mutex_local._4_4_;
}

Assistant:

int uv_mutex_trylock(uv_mutex_t* mutex) {
  int err;

  err = pthread_mutex_trylock(mutex);
  if (err) {
    if (err != EBUSY && err != EAGAIN)
      abort();
    return -EBUSY;
  }

  return 0;
}